

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O1

int MT32Emu::calcBasicAmp
              (Tables *tables,Partial *partial,System *system,PartialParam *partialParam,
              Bit8u partVolume,RhythmTemp *rhythmTemp,int biasAmpSubtraction,int veloAmpSubtraction,
              Bit8u expression,bool hasRingModQuirk)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (hasRingModQuirk) {
    bVar1 = Partial::isRingModulatingNoMix(partial);
  }
  else {
    bVar1 = Partial::isRingModulatingSlave(partial);
  }
  iVar3 = 0x9b;
  if ((((bVar1 == false) &&
       ((((0x9b < tables->masterVolToAmpSubtraction[system->masterVol] ||
          (uVar2 = (uint)tables->levelToAmpSubtraction[partVolume] +
                   (uint)tables->masterVolToAmpSubtraction[system->masterVol], 0x9b < uVar2)) ||
         (uVar2 = uVar2 + tables->levelToAmpSubtraction[expression], iVar3 = 0x9b - uVar2,
         0x9b < uVar2)) ||
        ((rhythmTemp != (RhythmTemp *)0x0 &&
         (iVar3 = iVar3 - (uint)tables->levelToAmpSubtraction[rhythmTemp->outputLevel], iVar3 < 0)))
        ))) || (iVar3 - biasAmpSubtraction < 0)) ||
     ((iVar3 = (iVar3 - biasAmpSubtraction) -
               (uint)tables->levelToAmpSubtraction[(partialParam->tva).level], iVar3 < 0 ||
      (iVar3 = iVar3 - veloAmpSubtraction, iVar3 < 0)))) {
    iVar3 = 0;
  }
  else {
    iVar4 = 0x9b;
    if (iVar3 < 0x9b) {
      iVar4 = iVar3;
    }
    iVar4 = iVar4 - (uint)((partialParam->tvf).resonance >> 1);
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

static int calcBasicAmp(const Tables *tables, const Partial *partial, const MemParams::System *system, const TimbreParam::PartialParam *partialParam, Bit8u partVolume, const MemParams::RhythmTemp *rhythmTemp, int biasAmpSubtraction, int veloAmpSubtraction, Bit8u expression, bool hasRingModQuirk) {
	int amp = 155;

	if (!(hasRingModQuirk ? partial->isRingModulatingNoMix() : partial->isRingModulatingSlave())) {
		amp -= tables->masterVolToAmpSubtraction[system->masterVol];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[partVolume];
		if (amp < 0) {
			return 0;
		}
		amp -= tables->levelToAmpSubtraction[expression];
		if (amp < 0) {
			return 0;
		}
		if (rhythmTemp != NULL) {
			amp -= tables->levelToAmpSubtraction[rhythmTemp->outputLevel];
			if (amp < 0) {
				return 0;
			}
		}
	}
	amp -= biasAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	amp -= tables->levelToAmpSubtraction[partialParam->tva.level];
	if (amp < 0) {
		return 0;
	}
	amp -= veloAmpSubtraction;
	if (amp < 0) {
		return 0;
	}
	if (amp > 155) {
		amp = 155;
	}
	amp -= partialParam->tvf.resonance >> 1;
	if (amp < 0) {
		return 0;
	}
	return amp;
}